

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_myinfo(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  AActor *this;
  PClass *pPVar6;
  
  bVar3 = CheckCheatmode(true);
  if ((!bVar3) && (this = (AActor *)(&players)[(long)consoleplayer * 0x54], this != (AActor *)0x0))
  {
    pPVar6 = (this->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar6;
      this = (AActor *)(&players)[(long)consoleplayer * 0x54];
    }
    pcVar2 = FName::NameData.NameArray
             [(pPVar6->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text;
    uVar1 = this->health;
    uVar5 = AActor::SpawnHealth(this);
    Printf("Target=%s, Health=%d, Spawnhealth=%d\n",pcVar2,(ulong)uVar1,(ulong)uVar5);
    PrintMiscActorInfo((AActor *)(&players)[(long)consoleplayer * 0x54]);
    return;
  }
  return;
}

Assistant:

CCMD(myinfo)
{
	if (CheckCheatmode () || players[consoleplayer].mo == NULL) return;
	Printf("Target=%s, Health=%d, Spawnhealth=%d\n",
		players[consoleplayer].mo->GetClass()->TypeName.GetChars(),
		players[consoleplayer].mo->health,
		players[consoleplayer].mo->SpawnHealth());
	PrintMiscActorInfo(players[consoleplayer].mo);
}